

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQOuter::~SQOuter(SQOuter *this)

{
  SQOuter *in_RDI;
  
  ~SQOuter(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~SQOuter() { REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this); }